

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c++
# Opt level: O0

void __thiscall kj::ThreadId::assertCurrentThread(ThreadId *this)

{
  bool bVar1;
  long *in_FS_OFFSET;
  Fault local_50;
  Fault f;
  void **local_40;
  undefined1 local_38 [8];
  DebugComparison<void_*const_&,_bool_*> _kjCondition;
  ThreadId *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (void **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->id);
  f.exception = (Exception *)(*in_FS_OFFSET + -0x18);
  kj::_::DebugExpression<void*const&>::operator==
            ((DebugComparison<void_*const_&,_bool_*> *)local_38,
             (DebugExpression<void*const&> *)&local_40,(bool **)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<void*const&,bool*>&>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common.c++"
               ,0x36,FAILED,"id == &currentThreadId","_kjCondition,",
               (DebugComparison<void_*const_&,_bool_*> *)local_38);
    kj::_::Debug::Fault::fatal(&local_50);
  }
  return;
}

Assistant:

void ThreadId::assertCurrentThread() const { KJ_ASSERT(id == &currentThreadId); }